

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::clara::detail::Help::Help(Help *this,bool *showHelpFlag)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  anon_class_8_1_beab0a68_for_m_lambda local_b0 [2];
  long local_a0 [2];
  value_type local_90;
  value_type local_70;
  value_type local_50;
  
  local_b0[0].showHelpFlag = showHelpFlag;
  Opt::Opt<Catch::clara::detail::Help::Help(bool&)::_lambda(bool)_1_>(&this->super_Opt,local_b0);
  (this->super_Opt).super_ParserRefImpl<Catch::clara::detail::Opt>.
  super_ComposableParserImpl<Catch::clara::detail::Opt>.super_ParserBase._vptr_ParserBase =
       (_func_int **)&PTR__Opt_001a3628;
  local_b0[0].showHelpFlag = (bool *)local_a0;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b0,"display usage information","");
  ::std::__cxx11::string::_M_assign
            ((string *)
             &(this->super_Opt).super_ParserRefImpl<Catch::clara::detail::Opt>.m_description);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"-?","");
  this_00 = &(this->super_Opt).m_optNames;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,&local_50);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"-h","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,&local_70);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"--help","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,&local_90);
  (this->super_Opt).super_ParserRefImpl<Catch::clara::detail::Opt>.m_optionality = Optional;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_b0[0].showHelpFlag != (bool *)local_a0) {
    operator_delete(local_b0[0].showHelpFlag,local_a0[0] + 1);
  }
  return;
}

Assistant:

Help( bool &showHelpFlag )
        :   Opt([&]( bool flag ) {
                showHelpFlag = flag;
                return ParserResult::ok( ParseResultType::ShortCircuitAll );
            })
        {
            static_cast<Opt &>( *this )
                    ("display usage information")
                    ["-?"]["-h"]["--help"]
                    .optional();
        }